

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_path_builder_delegate_unittest.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::
SimplePathBuilderDelegate1024SuccessTest_IsAcceptableSignatureAndKey_Test::
~SimplePathBuilderDelegate1024SuccessTest_IsAcceptableSignatureAndKey_Test
          (SimplePathBuilderDelegate1024SuccessTest_IsAcceptableSignatureAndKey_Test *this)

{
  anon_unknown_0::SimplePathBuilderDelegate1024SuccessTest_IsAcceptableSignatureAndKey_Test::
  ~SimplePathBuilderDelegate1024SuccessTest_IsAcceptableSignatureAndKey_Test
            ((SimplePathBuilderDelegate1024SuccessTest_IsAcceptableSignatureAndKey_Test *)
             (this + -0x10));
  return;
}

Assistant:

TEST_P(SimplePathBuilderDelegate1024SuccessTest, IsAcceptableSignatureAndKey) {
  SignatureAlgorithm signature_algorithm{};
  bssl::UniquePtr<EVP_PKEY> public_key;
  ASSERT_NO_FATAL_FAILURE(
      ReadTestCase(GetParam(), &signature_algorithm, &public_key));
  ASSERT_TRUE(public_key);

  CertErrors errors;
  SimplePathBuilderDelegate delegate(
      1024, SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

  EXPECT_TRUE(
      delegate.IsSignatureAlgorithmAcceptable(signature_algorithm, &errors));

  EXPECT_TRUE(delegate.IsPublicKeyAcceptable(public_key.get(), &errors));
}